

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

string * __thiscall
cmCustomCommandGenerator::GetFullDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  bool bVar1;
  string *psVar2;
  string depfile;
  string sStack_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  GetDepfile_abi_cxx11_(&sStack_b8,this);
  if (sStack_b8._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_48);
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsFullPath(&sStack_b8);
    if (!bVar1) {
      psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
      local_48.View_._M_str = (psVar2->_M_dataplus)._M_p;
      local_48.View_._M_len = psVar2->_M_string_length;
      local_78.View_._M_str = local_78.Digits_;
      local_78.View_._M_len = 1;
      local_78.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_98,&local_48,&local_78,&sStack_b8);
      std::__cxx11::string::operator=((string *)&sStack_b8,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&sStack_b8);
  }
  std::__cxx11::string::~string((string *)&sStack_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetFullDepfile() const
{
  std::string depfile = this->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  if (!cmSystemTools::FileIsFullPath(depfile)) {
    depfile = cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/', depfile);
  }
  return cmSystemTools::CollapseFullPath(depfile);
}